

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRUtil.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_type sVar3;
  undefined8 uVar4;
  ulong *puVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  mapped_type *pmVar9;
  ostream *poVar10;
  const_iterator cVar11;
  undefined8 uVar12;
  const_iterator cVar13;
  Device *device;
  ostream *poVar14;
  _Rb_tree_node_base *p_Var15;
  long *plVar16;
  char *pcVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  pointer pbVar18;
  ulong uVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target;
  ulong *puVar20;
  ulong uVar21;
  long lVar22;
  pointer pbVar23;
  string *psVar24;
  _Rb_tree_node_base *p_Var25;
  undefined1 auVar26 [12];
  ModuleManager mm;
  string factories;
  int long_index;
  string argStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sparseResults;
  stat info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modules;
  string driverName;
  string serial;
  string dirStr;
  string chanStr;
  string formatStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  searchPaths;
  ModuleManager local_249;
  pointer local_248;
  key_type local_240;
  undefined4 local_21c;
  string local_218;
  undefined1 local_1f8 [40];
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0 [8];
  double local_140;
  undefined *local_138;
  undefined *local_130;
  undefined *local_128;
  undefined *local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  string local_100;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 local_d0 [16];
  string local_c0;
  string local_a0;
  string local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  ulong *local_48;
  ulong *local_40;
  
  SoapySDR::ModuleManager::ModuleManager(&local_249,false);
  local_e0 = local_d0;
  local_d8 = (char *)0x0;
  local_d0[0] = 0;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_120 = (undefined *)0x0;
  local_100.field_2._M_local_buf[0] = '\0';
  local_21c = 0;
  local_140 = 0.0;
  local_248 = (pointer)0x0;
  local_128 = (undefined *)0x0;
  local_130 = (undefined *)0x0;
  local_138 = (undefined *)0x0;
switchD_00104854_caseD_62:
  do {
    while( true ) {
      iVar6 = getopt_long_only(argc,argv,"",main::long_options,&local_21c);
      pcVar2 = local_d8;
      sVar3 = local_218._M_string_length;
      pcVar17 = _optarg;
      if (iVar6 - 0x61U < 0x17) goto code_r0x0010484d;
      if (iVar6 != 0x53) break;
      strlen(_optarg);
      std::__cxx11::string::_M_replace((ulong)&local_e0,0,pcVar2,(ulong)pcVar17);
    }
  } while (iVar6 != -1);
  if (local_d8 != (char *)0x0) {
    SoapySDR::KwargsFromString((string *)local_1d0);
    paVar1 = &local_240.field_2;
    local_240._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"serial","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_1d0,&local_240);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar1) {
      operator_delete(local_240._M_dataplus._M_p);
    }
    SoapySDR::KwargsToString((map *)&local_240);
    std::__cxx11::string::operator=((string *)&local_218,(string *)&local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar1) {
      operator_delete(local_240._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_1d0);
  }
  pbVar23 = local_248;
  if (((ulong)local_248 & 1) == 0) {
    printBanner();
  }
  if (local_100._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Loading modules... ",0x13);
    std::ostream::flush();
    SoapySDR::loadModules();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done",4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Checking driver \'",0x11);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_100._M_dataplus._M_p,local_100._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'... ",5);
    std::ostream::flush();
    SoapySDR::Registry::listFindFunctions_abi_cxx11_();
    cVar11 = std::_Rb_tree<$6c97574c$>::find((_Rb_tree<_6c97574c_> *)local_1d0,&local_100);
    if (cVar11._M_node == (_Base_ptr)(local_1d0 + 8)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MISSING!",8);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PRESENT",7);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
    }
    uVar7 = (uint)(cVar11._M_node == (_Base_ptr)(local_1d0 + 8));
    std::_Rb_tree<$6c97574c$>::~_Rb_tree((_Rb_tree<_6c97574c_> *)local_1d0);
    goto LAB_00105560;
  }
  if (((ulong)local_120 & 1) != 0) {
    SoapySDR::Device::enumerate((string *)&local_240);
    if (((ulong)pbVar23 & 1) == 0) {
      if ((pointer)local_240._M_string_length == local_240._M_dataplus._M_p) goto LAB_00105d92;
      pbVar23 = (pointer)0x0;
      poVar10 = (ostream *)&std::cout;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Found device ",0xd);
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
        p_Var25 = (_Rb_tree_node_base *)(local_240._M_dataplus._M_p + (long)pbVar23 * 0x30 + 8);
        local_248 = pbVar23;
        for (p_Var15 = *(_Rb_tree_node_base **)
                        (local_240._M_dataplus._M_p + (long)pbVar23 * 0x30 + 0x18);
            p_Var15 != p_Var25; p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,*(char **)(p_Var15 + 1),
                               (long)p_Var15[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," = ",3);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,*(char **)(p_Var15 + 2),(long)p_Var15[2]._M_parent);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
          std::ostream::put((char)poVar14);
          std::ostream::flush();
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
        pbVar23 = local_248;
        std::ostream::put('\x10');
        std::ostream::flush();
        pbVar23 = (pointer)((long)&(pbVar23->_M_dataplus)._M_p + 1);
      } while (pbVar23 < (pointer)(((long)(local_240._M_string_length -
                                          (long)local_240._M_dataplus._M_p) >> 4) *
                                  -0x5555555555555555));
      if (local_240._M_dataplus._M_p == (pointer)local_240._M_string_length) {
LAB_00105d92:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"No devices found! ",0x12);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,local_218._M_dataplus._M_p,
                             local_218._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      }
      else {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      }
      std::ostream::put((char)poVar10);
      std::ostream::flush();
    }
    else {
      local_1f8._0_8_ = (pointer)0x0;
      local_1f8._8_8_ = (pointer)0x0;
      local_1f8._16_8_ = (pointer)0x0;
      if ((pointer)local_240._M_string_length != local_240._M_dataplus._M_p) {
        lVar22 = 0;
        uVar21 = 0;
        do {
          local_1c0[0]._M_local_buf[4] = 'l';
          local_1c0[0]._M_allocated_capacity._0_4_ = 0x6562616c;
          local_1d0._8_8_ = 5;
          local_1c0[0]._M_local_buf[5] = '\0';
          local_1d0._0_8_ = local_1c0;
          cVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(local_240._M_dataplus._M_p + lVar22),(key_type *)local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._0_8_ != local_1c0) {
            operator_delete((void *)local_1d0._0_8_);
          }
          if ((_Base_ptr)(local_240._M_dataplus._M_p + lVar22 + 8) == cVar13._M_node) {
            SoapySDR::KwargsToString((map *)local_1d0);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_1f8,(key_type *)local_1d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._0_8_ != local_1c0) {
              operator_delete((void *)local_1d0._0_8_);
            }
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1f8,(value_type *)(cVar13._M_node + 2));
          }
          uVar4 = local_1f8._8_8_;
          uVar12 = local_1f8._0_8_;
          uVar21 = uVar21 + 1;
          lVar22 = lVar22 + 0x30;
        } while (uVar21 < (ulong)(((long)(local_240._M_string_length -
                                         (long)local_240._M_dataplus._M_p) >> 4) *
                                 -0x5555555555555555));
        if (local_1f8._0_8_ != local_1f8._8_8_) {
          uVar21 = (long)(local_1f8._8_8_ - local_1f8._0_8_) >> 5;
          lVar22 = 0x3f;
          if (uVar21 != 0) {
            for (; uVar21 >> lVar22 == 0; lVar22 = lVar22 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_1f8._0_8_,local_1f8._8_8_,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (uVar12,uVar4);
          if (local_1f8._8_8_ != local_1f8._0_8_) {
            lVar22 = 8;
            uVar21 = 0;
            do {
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,*(char **)(local_1f8._0_8_ + lVar22 + -8),
                                   *(long *)((long)&((_Alloc_hider *)local_1f8._0_8_)->_M_p + lVar22
                                            ));
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              uVar21 = uVar21 + 1;
              lVar22 = lVar22 + 0x20;
            } while (uVar21 < (ulong)((long)(local_1f8._8_8_ - local_1f8._0_8_) >> 5));
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1f8);
    }
    uVar7 = (uint)(local_240._M_dataplus._M_p == (pointer)local_240._M_string_length);
    std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~vector((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)&local_240);
    goto LAB_00105560;
  }
  if (((ulong)local_128 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Make device ",0xc);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_218._M_dataplus._M_p,local_218._M_string_length
                        );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    local_248 = (pointer)SoapySDR::Device::make((string *)&local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  driver=",9);
    (**(code **)((local_248->_M_dataplus)._M_p + 0x10))(local_1d0);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_1d0._0_8_,local_1d0._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._0_8_ != local_1c0) {
      operator_delete((void *)local_1d0._0_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  hardware=",0xb);
    (**(code **)((local_248->_M_dataplus)._M_p + 0x18))(local_1d0);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_1d0._0_8_,local_1d0._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._0_8_ != local_1c0) {
      operator_delete((void *)local_1d0._0_8_);
    }
    (**(code **)((local_248->_M_dataplus)._M_p + 0x20))(local_1d0);
    for (; (_Rb_tree_node_base *)local_1c0[0]._8_8_ != (_Rb_tree_node_base *)(local_1d0 + 8);
        local_1c0[0]._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_1c0[0]._8_8_)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,*(char **)(local_1c0[0]._8_8_ + 0x20),
                           (long)((_Rb_tree_node_base *)(local_1c0[0]._8_8_ + 0x20))->_M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"=",1);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,*(char **)(local_1c0[0]._8_8_ + 0x40),
                           (long)((_Rb_tree_node_base *)(local_1c0[0]._8_8_ + 0x40))->_M_parent);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_1d0);
    SoapySDR::Device::unmake((Device *)local_248);
LAB_00105bd8:
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    goto LAB_0010555e;
  }
  if (((ulong)local_130 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Probe device ",0xd);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_218._M_dataplus._M_p,local_218._M_string_length
                        );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    device = (Device *)SoapySDR::Device::make((string *)&local_218);
    SoapySDRDeviceProbe_abi_cxx11_((string *)local_1d0,device);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_1d0._0_8_,local_1d0._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._0_8_ != local_1c0) {
      operator_delete((void *)local_1d0._0_8_);
    }
    SoapySDR::Device::unmake(device);
    goto LAB_00105bd8;
  }
  if (((ulong)local_138 & 1) != 0) {
    uVar7 = watchDevice(&local_218);
    goto LAB_00105560;
  }
  if ((local_140 == 0.0) && (!NAN(local_140))) goto LAB_00104d6e;
  uVar7 = SoapySDRRateTest(&local_218,local_140,&local_80,&local_a0,&local_c0);
  goto LAB_00105560;
code_r0x0010484d:
  switch(iVar6) {
  case 0x61:
    psVar24 = &local_218;
    break;
  default:
    goto switchD_00104854_caseD_62;
  case 99:
    psVar24 = &local_100;
    break;
  case 100:
    psVar24 = &local_c0;
    break;
  case 0x66:
    local_120 = &DAT_00112001;
    if (_optarg != (char *)0x0) {
      strlen(_optarg);
      std::__cxx11::string::_M_replace((ulong)&local_218,0,(char *)sVar3,(ulong)pcVar17);
    }
    goto switchD_00104854_caseD_62;
  case 0x68:
    goto switchD_00104854_caseD_68;
  case 0x69:
    printBanner();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Lib Version: v",0xe);
    SoapySDR::getLibVersion_abi_cxx11_();
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_1d0._0_8_,local_1d0._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._0_8_ != local_1c0) {
      operator_delete((void *)local_1d0._0_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"API Version: v",0xe);
    SoapySDR::getAPIVersion_abi_cxx11_();
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_1d0._0_8_,local_1d0._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._0_8_ != local_1c0) {
      operator_delete((void *)local_1d0._0_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ABI Version: v",0xe);
    SoapySDR::getABIVersion_abi_cxx11_();
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_1d0._0_8_,local_1d0._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._0_8_ != local_1c0) {
      operator_delete((void *)local_1d0._0_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Install root: ",0xe);
    SoapySDR::getRootPath_abi_cxx11_();
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_1d0._0_8_,local_1d0._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._0_8_ != local_1c0) {
      operator_delete((void *)local_1d0._0_8_);
    }
    SoapySDR::listSearchPaths_abi_cxx11_();
    SoapySDR::listModules_abi_cxx11_();
    pbVar23 = local_118.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_60.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_60.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar21 = 0;
    }
    else {
      pbVar18 = local_60.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar19 = 0;
      do {
        uVar21 = pbVar18->_M_string_length;
        if (pbVar18->_M_string_length < uVar19) {
          uVar21 = uVar19;
        }
        pbVar18 = pbVar18 + 1;
        uVar19 = uVar21;
      } while (pbVar18 !=
               local_60.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    for (; pbVar23 !=
           local_118.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; pbVar23 = pbVar23 + 1) {
      uVar19 = pbVar23->_M_string_length;
      if (pbVar23->_M_string_length < uVar21) {
        uVar19 = uVar21;
      }
      uVar21 = uVar19;
    }
    if (local_60.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_60.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar23 = local_60.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        iVar6 = stat((pbVar23->_M_dataplus)._M_p,(stat *)local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Search path:  ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(pbVar23->_M_dataplus)._M_p,pbVar23->_M_string_length);
        if (iVar6 != 0) {
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_240,(char)uVar21 - (char)pbVar23->_M_string_length);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_240._M_dataplus._M_p,
                               local_240._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," (missing)",10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p);
          }
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
        std::ostream::put('\x10');
        std::ostream::flush();
        pbVar23 = pbVar23 + 1;
      } while (pbVar23 !=
               local_60.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pbVar23 = local_118.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0010521c:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"No modules found!",0x11);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
    }
    else {
      pbVar18 = local_118.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Module found: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(pbVar18->_M_dataplus)._M_p,pbVar18->_M_string_length);
        SoapySDR::loadModule((string *)local_1d0);
        if (local_1d0._8_8_ != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n  ",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_1d0._0_8_,local_1d0._8_8_);
        }
        SoapySDR::getModuleVersion((string *)&local_240);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_string_length !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          local_1f8._0_8_ = (pointer)(local_1f8 + 0x10);
          std::__cxx11::string::_M_construct
                    ((ulong)local_1f8,(char)uVar21 - (char)pbVar18->_M_string_length);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)local_1f8._0_8_,local_1f8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," (",2);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_240._M_dataplus._M_p,local_240._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
          if ((pointer)local_1f8._0_8_ != (pointer)(local_1f8 + 0x10)) {
            operator_delete((void *)local_1f8._0_8_);
          }
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
        std::ostream::put('\x10');
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._0_8_ != local_1c0) {
          operator_delete((void *)local_1d0._0_8_);
        }
        pbVar18 = pbVar18 + 1;
      } while (pbVar18 != pbVar23);
      if (local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0010521c;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Available factories... ",0x17);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    local_240._M_string_length = 0;
    local_240.field_2._M_local_buf[0] = '\0';
    SoapySDR::Registry::listFindFunctions_abi_cxx11_();
    if ((_Rb_tree_node_base *)local_1c0[0]._8_8_ != (_Rb_tree_node_base *)(local_1d0 + 8)) {
      uVar12 = local_1c0[0]._8_8_;
      do {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_string_length !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::__cxx11::string::append((char *)&local_240);
        }
        std::__cxx11::string::_M_append((char *)&local_240,*(ulong *)(uVar12 + 0x20));
        uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12);
      } while ((_Rb_tree_node_base *)uVar12 != (_Rb_tree_node_base *)(local_1d0 + 8));
    }
    std::_Rb_tree<$6c97574c$>::~_Rb_tree((_Rb_tree<_6c97574c_> *)local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_string_length ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::__cxx11::string::_M_replace((ulong)&local_240,0,(char *)0x0,0x10d52a);
    }
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_240._M_dataplus._M_p,local_240._M_string_length
                        );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Available converters...",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    SoapySDR::ConverterRegistry::listAvailableSourceFormats_abi_cxx11_();
    local_248 = (pointer)local_1f8._8_8_;
    if (local_1f8._0_8_ != local_1f8._8_8_) {
      pbVar23 = (pointer)local_1f8._0_8_;
      do {
        local_1d0._0_8_ = local_1c0;
        local_1d0._8_8_ = 0;
        local_1c0[0]._M_allocated_capacity._0_4_ =
             (undefined4)local_1c0[0]._M_allocated_capacity & 0xffffff00;
        SoapySDR::ConverterRegistry::listTargetFormats((string *)&local_48);
        puVar5 = local_40;
        for (puVar20 = local_48; puVar20 != puVar5; puVar20 = puVar20 + 4) {
          if (local_1d0._8_8_ != 0) {
            std::__cxx11::string::append(local_1d0);
          }
          std::__cxx11::string::_M_append(local_1d0,*puVar20);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_48);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," - ",3);
        *(undefined8 *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) = 5;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(pbVar23->_M_dataplus)._M_p,
                             pbVar23->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," -> [",5);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,(char *)local_1d0._0_8_,local_1d0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._0_8_ != local_1c0) {
          operator_delete((void *)local_1d0._0_8_);
        }
        pbVar23 = pbVar23 + 1;
      } while (pbVar23 != local_248);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_118);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
LAB_0010555e:
    uVar7 = 0;
LAB_00105560:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if (local_e0 != local_d0) {
      operator_delete(local_e0);
    }
    SoapySDR::ModuleManager::~ModuleManager(&local_249);
    return uVar7;
  case 0x6d:
    local_128 = &DAT_00112001;
    if (_optarg != (char *)0x0) {
      strlen(_optarg);
      std::__cxx11::string::_M_replace((ulong)&local_218,0,(char *)sVar3,(ulong)pcVar17);
    }
    goto switchD_00104854_caseD_62;
  case 0x6e:
    psVar24 = &local_a0;
    break;
  case 0x70:
    local_130 = &DAT_00112001;
    if (_optarg != (char *)0x0) {
      strlen(_optarg);
      std::__cxx11::string::_M_replace((ulong)&local_218,0,(char *)sVar3,(ulong)pcVar17);
    }
    goto switchD_00104854_caseD_62;
  case 0x72:
    if (_optarg == (char *)0x0) goto switchD_00104854_caseD_62;
    std::__cxx11::string::string((string *)local_1d0,_optarg,(allocator *)local_1f8);
    uVar12 = local_1d0._0_8_;
    piVar8 = __errno_location();
    iVar6 = *piVar8;
    *piVar8 = 0;
    local_140 = strtod((char *)uVar12,(char **)&local_240);
    if (local_240._M_dataplus._M_p != (pointer)uVar12) {
      if (*piVar8 == 0) {
        *piVar8 = iVar6;
      }
      else if (*piVar8 == 0x22) goto LAB_00105e72;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._0_8_ != local_1c0) {
        operator_delete((void *)local_1d0._0_8_);
      }
      goto switchD_00104854_caseD_62;
    }
    std::__throw_invalid_argument("stod");
LAB_00105e72:
    auVar26 = std::__throw_out_of_range("stod");
    if (auVar26._8_4_ != 1) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
      if (local_e0 != local_d0) {
        operator_delete(local_e0);
      }
      SoapySDR::ModuleManager::~ModuleManager(&local_249);
      _Unwind_Resume(auVar26._0_8_);
    }
    plVar16 = (long *)__cxa_begin_catch(auVar26._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error probing device: ",0x16);
    pcVar17 = (char *)(**(code **)(*plVar16 + 0x10))(plVar16);
    poVar10 = std::operator<<((ostream *)&std::cerr,pcVar17);
    std::endl<char,std::char_traits<char>>(poVar10);
    uVar7 = 1;
    __cxa_end_catch();
    goto LAB_00105560;
  case 0x73:
    local_248 = (pointer)CONCAT71((int7)((ulong)((long)&switchD_00104854::switchdataD_0010d004 +
                                                (long)(int)(&switchD_00104854::switchdataD_0010d004)
                                                           [iVar6 - 0x61U]) >> 8),1);
    goto switchD_00104854_caseD_62;
  case 0x74:
    psVar24 = &local_80;
    break;
  case 0x77:
    local_138 = &DAT_00112001;
    if (_optarg != (char *)0x0) {
      strlen(_optarg);
      std::__cxx11::string::_M_replace((ulong)&local_218,0,(char *)sVar3,(ulong)pcVar17);
    }
    goto switchD_00104854_caseD_62;
  }
  if (_optarg != (char *)0x0) {
    pcVar2 = (char *)psVar24->_M_string_length;
    strlen(_optarg);
    std::__cxx11::string::_M_replace((ulong)psVar24,0,pcVar2,(ulong)pcVar17);
  }
  goto switchD_00104854_caseD_62;
switchD_00104854_caseD_68:
  printBanner();
LAB_00104d6e:
  printHelp();
  goto LAB_0010555e;
}

Assistant:

int main(int argc, char *argv[])
{
    //unload any loaded modules when main() scope unwinds
    SoapySDR::ModuleManager mm(false);

    std::string serial;
    std::string argStr;
    std::string formatStr;
    std::string chanStr;
    std::string dirStr;
    double sampleRate(0.0);
    std::string driverName;
    bool findDevicesFlag(false);
    bool sparsePrintFlag(false);
    bool makeDeviceFlag(false);
    bool probeDeviceFlag(false);
    bool watchDeviceFlag(false);

    /*******************************************************************
     * parse command line options
     ******************************************************************/
    static struct option long_options[] = {
        {"help", no_argument, nullptr, 'h'},
        {"find", optional_argument, nullptr, 'f'},
        {"make", optional_argument, nullptr, 'm'},
        {"info", optional_argument, nullptr, 'i'},
        {"probe", optional_argument, nullptr, 'p'},
        {"watch", optional_argument, nullptr, 'w'},

        {"check", optional_argument, nullptr, 'c'},
        {"sparse", no_argument, nullptr, 's'},
        {"serial", required_argument, nullptr, 'S'},

        {"args", optional_argument, nullptr, 'a'},
        {"rate", optional_argument, nullptr, 'r'},
        {"format", optional_argument, nullptr, 't'},
        {"channels", optional_argument, nullptr, 'n'},
        {"direction", optional_argument, nullptr, 'd'},
        {nullptr, no_argument, nullptr, '\0'}
    };
    int long_index = 0;
    int option = 0;
    while ((option = getopt_long_only(argc, argv, "", long_options, &long_index)) != -1)
    {
        switch (option)
        {
        case 'h':
            printBanner();
            return printHelp();
        case 'i':
            printBanner();
            return printInfo();
        case 'f':
            findDevicesFlag = true;
            if (optarg != nullptr) argStr = optarg;
            break;
        case 'm':
            makeDeviceFlag = true;
            if (optarg != nullptr) argStr = optarg;
            break;
        case 'p':
            probeDeviceFlag = true;
            if (optarg != nullptr) argStr = optarg;
            break;
        case 'w':
            watchDeviceFlag = true;
            if (optarg != nullptr) argStr = optarg;
            break;
        case 'c':
            if (optarg != nullptr) driverName = optarg;
            break;
        case 's':
            sparsePrintFlag = true;
            break;
        case 'S':
            serial = optarg;
            break;
        case 'a':
            if (optarg != nullptr) argStr = optarg;
            break;
        case 'r':
            if (optarg != nullptr) sampleRate = std::stod(optarg);
            break;
        case 't':
            if (optarg != nullptr) formatStr = optarg;
            break;
        case 'n':
            if (optarg != nullptr) chanStr = optarg;
            break;
        case 'd':
            if (optarg != nullptr) dirStr = optarg;
            break;
        }
    }

    //use serial if provided
    if (not serial.empty())
    {
        auto args = SoapySDR::KwargsFromString(argStr);
        args["serial"] = serial;
        argStr = SoapySDR::KwargsToString(args);
    }

    if (not sparsePrintFlag) printBanner();
    if (not driverName.empty()) return checkDriver(driverName);
    if (findDevicesFlag) return findDevices(argStr, sparsePrintFlag);
    if (makeDeviceFlag)  return makeDevice(argStr);
    if (probeDeviceFlag) return probeDevice(argStr);
    if (watchDeviceFlag) return watchDevice(argStr);

    //invoke utilities that rely on multiple arguments
    if (sampleRate != 0.0)
    {
        return SoapySDRRateTest(argStr, sampleRate, formatStr, chanStr, dirStr);
    }

    //unknown or unspecified options, do help...
    return printHelp();
}